

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O1

bool bloaty::Options_SortBy_IsValid(int value)

{
  return (uint)value < 3;
}

Assistant:

bool Options_SortBy_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}